

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::MultiplyRow(Matrix *this,int row,Fraction coefficient)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int column;
  long lVar4;
  long lVar5;
  Fraction coefficient_local;
  Fraction local_38;
  
  coefficient_local = coefficient;
  Fraction::Fraction(&local_38,1);
  bVar2 = operator==(&coefficient_local,&local_38);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    lVar5 = 0;
    bVar2 = false;
    for (lVar4 = 0; lVar4 < this->m_; lVar4 = lVar4 + 1) {
      lVar1 = *(long *)&(this->elements_).
                        super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[row].
                        super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                        super__Vector_impl_data;
      Fraction::Fraction(&local_38,0);
      bVar3 = operator!=((Fraction *)(lVar1 + lVar5),&local_38);
      if (bVar3) {
        Fraction::operator*=
                  ((Fraction *)
                   (*(long *)&(this->elements_).
                              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[row].
                              super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                              super__Vector_impl_data + lVar5),&coefficient_local);
        bVar2 = true;
      }
      lVar5 = lVar5 + 8;
    }
  }
  return bVar2;
}

Assistant:

bool Matrix::MultiplyRow(int row, Fraction coefficient) {
  if (coefficient == 1) {
    return false;
  }

  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[row][column] != 0) {
      result = true;
      elements_[row][column] *= coefficient;
    }
  }

  return result;
}